

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

word Gia_LutComputeTruth6Map(Gia_Man_t *p,int iPo,Vec_Int_t *vMap)

{
  int iObj;
  Gia_Obj_t *pObj;
  word wVar1;
  
  pObj = Gia_ManPo(p,iPo);
  iObj = Gia_ObjFaninId0p(p,pObj);
  wVar1 = Gia_LutComputeTruth6Map_rec(p,iObj,vMap);
  return wVar1 ^ (long)((*(int *)pObj << 2) >> 0x1f);
}

Assistant:

word Gia_LutComputeTruth6Map( Gia_Man_t * p, int iPo, Vec_Int_t * vMap )
{
    Gia_Obj_t * pObj = Gia_ManPo( p, iPo );
    word Truth = Gia_LutComputeTruth6Map_rec( p, Gia_ObjFaninId0p(p, pObj), vMap );
    return Gia_ObjFaninC0(pObj) ? ~Truth : Truth;
}